

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pObj_00;
  int local_30;
  int Level;
  int iFan;
  int k;
  int iObj;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  local_30 = 0;
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTim.c"
                      ,0x239,"int Gia_ManLutLevelWithBoxes_rec(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar1 = Gia_ObjId(p,pObj);
      for (Level = 0; iVar2 = Gia_ObjLutSize(p,iVar1), Level < iVar2; Level = Level + 1) {
        piVar4 = Gia_ObjLutFanins(p,iVar1);
        iVar2 = piVar4[Level];
        pObj_00 = Gia_ManObj(p,iVar2);
        iVar3 = Gia_ManLutLevelWithBoxes_rec(p,pObj_00);
        if (iVar3 != 0) {
          return 1;
        }
        iVar2 = Gia_ObjLevelId(p,iVar2);
        local_30 = Abc_MaxInt(local_30,iVar2);
      }
      Gia_ObjSetLevelId(p,iVar1,local_30 + 1);
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Gia_ManLutLevelWithBoxes_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    int iObj, k, iFan, Level = 0;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return 0;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
        return 1;
    assert( Gia_ObjIsAnd(pObj) );
    iObj = Gia_ObjId( p, pObj );
    Gia_LutForEachFanin( p, iObj, iFan, k )
    {
        if ( Gia_ManLutLevelWithBoxes_rec( p, Gia_ManObj(p, iFan) ) )
            return 1;
        Level = Abc_MaxInt( Level, Gia_ObjLevelId(p, iFan) );
    }
    Gia_ObjSetLevelId( p, iObj, Level + 1 );
    return 0;
}